

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

FieldDescriptor * __thiscall
google::protobuf::DescriptorPool::FindExtensionByPrintableName
          (DescriptorPool *this,Descriptor *extendee,string_view printable_name)

{
  bool bVar1;
  FieldDescriptor *pFVar2;
  Descriptor *this_00;
  Descriptor *pDVar3;
  int index;
  int iVar4;
  
  if (extendee->extension_range_count_ != 0) {
    pFVar2 = FindExtensionByName(this,printable_name);
    if ((pFVar2 != (FieldDescriptor *)0x0) && (pFVar2->containing_type_ == extendee)) {
      return pFVar2;
    }
    if (((extendee->options_->field_0)._impl_.message_set_wire_format_ == true) &&
       (this_00 = FindMessageTypeByName(this,printable_name), this_00 != (Descriptor *)0x0)) {
      iVar4 = this_00->extension_count_;
      if (iVar4 < 1) {
        iVar4 = 0;
      }
      for (index = 0; iVar4 != index; index = index + 1) {
        pFVar2 = Descriptor::extension(this_00,index);
        if ((((pFVar2->containing_type_ == extendee) && (pFVar2->type_ == '\v')) &&
            ((pFVar2->merged_features_->field_0)._impl_.field_presence_ != 3)) &&
           ((bVar1 = FieldDescriptor::is_repeated(pFVar2), !bVar1 &&
            (pDVar3 = FieldDescriptor::message_type(pFVar2), pDVar3 == this_00)))) {
          return pFVar2;
        }
      }
    }
  }
  return (FieldDescriptor *)0x0;
}

Assistant:

const FieldDescriptor* DescriptorPool::FindExtensionByPrintableName(
    const Descriptor* extendee, absl::string_view printable_name) const {
  if (extendee->extension_range_count() == 0) return nullptr;
  const FieldDescriptor* result = FindExtensionByName(printable_name);
  if (result != nullptr && result->containing_type() == extendee) {
    return result;
  }
  if (extendee->options().message_set_wire_format()) {
    // MessageSet extensions may be identified by type name.
    const Descriptor* type = FindMessageTypeByName(printable_name);
    if (type != nullptr) {
      // Look for a matching extension in the foreign type's scope.
      const int type_extension_count = type->extension_count();
      for (int i = 0; i < type_extension_count; i++) {
        const FieldDescriptor* extension = type->extension(i);
        if (extension->containing_type() == extendee &&
            extension->type() == FieldDescriptor::TYPE_MESSAGE &&
            !extension->is_required() && !extension->is_repeated() &&
            extension->message_type() == type) {
          // Found it.
          return extension;
        }
      }
    }
  }
  return nullptr;
}